

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O3

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0
          (CrossingProcessor *this,ShapeEdgeId a_id,Edge *a,CrossingIterator *it)

{
  double dVar1;
  double dVar2;
  IndexCrossing *pIVar3;
  PointCrossingResult PVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  S2LogMessage local_30;
  
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)(a->v0).c_ + lVar5);
    dVar2 = *(double *)((long)(a->v1).c_ + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar7 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar7);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    S2LogMessage::S2LogMessage
              (&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x52d,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_30.stream_,"Check failed: (a.v0) == (a.v1) ",0x1f);
    abort();
  }
  if (this->invert_a_ == this->invert_result_) {
    PVar4 = ProcessPointCrossings(this,a_id,&a->v0,it);
    bVar7 = this->invert_b_;
    bVar8 = this->inside_ != bVar7;
    bVar6 = this->polygon_model_ == CLOSED;
    if (this->polygon_model_ == SEMI_OPEN) {
      bVar6 = bVar8;
    }
    if (((uint3)PVar4 >> 0x10 & 1) == 0) {
      bVar6 = bVar8;
    }
    bVar6 = (bool)(PVar4.matches_polyline & 1U | bVar6);
    bVar8 = true;
    if ((this->is_union_ & 1U) != 0) {
      bVar8 = bVar6;
    }
    if (((uint3)PVar4 & 1) == 0) {
      bVar8 = bVar6;
    }
    if (bVar8 != bVar7) {
      bVar7 = AddPointEdge(this,&a->v0,0);
      return bVar7;
    }
  }
  else {
    while (pIVar3 = (it->it_)._M_current, pIVar3->a == a_id) {
      (it->it_)._M_current = pIVar3 + 1;
      CrossingIterator::Update(it);
    }
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::ProcessEdge0(
    ShapeEdgeId a_id, const S2Shape::Edge& a, CrossingIterator* it) {
  S2_DCHECK_EQ(a.v0, a.v1);
  // When a region is inverted, all points and polylines are discarded.
  if (invert_a_ != invert_result_) {
    SkipCrossings(a_id, it);
    return true;
  }
  PointCrossingResult r = ProcessPointCrossings(a_id, a.v0, it);

  // "contained" indicates whether the current point is inside the polygonal
  // interior of the opposite region, using semi-open boundaries.
  bool contained = inside_ ^ invert_b_;
  if (r.matches_polygon && polygon_model_ != PolygonModel::SEMI_OPEN) {
    contained = (polygon_model_ == PolygonModel::CLOSED);
  }
  if (r.matches_polyline) contained = true;

  // The output of UNION includes duplicate values, so ensure that points are
  // not suppressed by other points.
  if (r.matches_point && !is_union_) contained = true;

  // Test whether the point is contained after region B is inverted.
  if (contained == invert_b_) return true;  // Don't exit early.
  return AddPointEdge(a.v0, 0);
}